

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O2

Bool Insert_Y_Turn(black_PWorker worker,Int y)

{
  uint uVar1;
  PLong plVar2;
  PLong plVar3;
  Int IVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long *plVar8;
  bool bVar9;
  
  uVar1 = worker->numTurns;
  plVar2 = worker->sizeBuff;
  lVar6 = (long)(int)uVar1;
  plVar8 = plVar2 + ((ulong)uVar1 - lVar6);
  uVar5 = uVar1;
  do {
    plVar8 = plVar8 + -1;
    if ((int)uVar5 < 1) goto LAB_001ff335;
    uVar5 = uVar5 - 1;
  } while ((long)y < *plVar8);
  if (*plVar8 < (long)y) {
    uVar7 = (ulong)uVar5;
    IVar4 = y;
    do {
      y = (Int)plVar2[uVar7 - lVar6];
      plVar2[uVar7 - lVar6] = (long)IVar4;
      bVar9 = uVar7 != 0;
      uVar7 = uVar7 - 1;
      IVar4 = y;
    } while (bVar9);
LAB_001ff335:
    plVar3 = worker->maxBuff;
    worker->maxBuff = plVar3 + -1;
    if (plVar3 + -1 <= worker->top) {
      worker->error = 0x62;
      return '\x01';
    }
    worker->numTurns = uVar1 + 1;
    plVar2[(int)~uVar1] = (long)y;
  }
  return '\0';
}

Assistant:

static Bool
  Insert_Y_Turn( RAS_ARGS Int  y )
  {
    PLong  y_turns;
    Int    n;


    n       = ras.numTurns - 1;
    y_turns = ras.sizeBuff - ras.numTurns;

    /* look for first y value that is <= */
    while ( n >= 0 && y < y_turns[n] )
      n--;

    /* if it is <, simply insert it, ignore if == */
    if ( n >= 0 && y > y_turns[n] )
      do
      {
        Int  y2 = (Int)y_turns[n];


        y_turns[n] = y;
        y = y2;
      } while ( --n >= 0 );

    if ( n < 0 )
    {
      ras.maxBuff--;
      if ( ras.maxBuff <= ras.top )
      {
        ras.error = FT_THROW( Raster_Overflow );
        return FAILURE;
      }
      ras.numTurns++;
      ras.sizeBuff[-ras.numTurns] = y;
    }

    return SUCCESS;
  }